

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPasvDataTransfer.cpp
# Opt level: O2

int __thiscall CPasvDataTransfer::GetIpAndPort(CPasvDataTransfer *this,string *ip)

{
  sockaddr *psVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  ostream *poVar6;
  allocator local_91;
  ifaddrs *ifAddrStruct;
  string *local_88;
  socklen_t len;
  char addressBuffer [16];
  sockaddr_in sin;
  string local_50 [32];
  
  len = 0x10;
  local_88 = ip;
  iVar2 = getsockname(this->m_Sock,(sockaddr *)&sin,&len);
  if (iVar2 == 0) {
    ifAddrStruct = (ifaddrs *)0x0;
    getifaddrs(&ifAddrStruct);
    for (; ifAddrStruct != (ifaddrs *)0x0; ifAddrStruct = ifAddrStruct->ifa_next) {
      psVar1 = ifAddrStruct->ifa_addr;
      if (psVar1->sa_family == 2) {
        bzero(addressBuffer,0x10);
        inet_ntop(2,psVar1->sa_data + 2,addressBuffer,0x10);
        iVar2 = bcmp(addressBuffer,"127.0.0.1",10);
        if (iVar2 != 0) {
          sVar3 = strlen(addressBuffer);
          if (1 < sVar3) break;
        }
      }
    }
    sVar3 = strlen(addressBuffer);
    if (1 < sVar3) {
      std::__cxx11::string::string(local_50,addressBuffer,&local_91);
      std::__cxx11::string::operator=((string *)local_88,local_50);
      std::__cxx11::string::~string(local_50);
      return (int)(ushort)(sin.sin_port << 8 | sin.sin_port >> 8);
    }
    poVar6 = (ostream *)&std::cout;
    pcVar5 = "Get local ip error,now exit.";
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"Get sockname error: ");
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
  }
  poVar6 = std::operator<<(poVar6,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar6);
  exit(-1);
}

Assistant:

int CPasvDataTransfer::GetIpAndPort(string &ip) {
    struct sockaddr_in sin;
    socklen_t  len = sizeof(sin);
    if(getsockname(m_Sock,(struct sockaddr*)&sin,&len) != 0){
        cout << "Get sockname error: " << strerror(errno) << endl;
        exit(-1);
    }
    struct ifaddrs *ifAddrStruct = NULL;
    void *tmpAddrPtr = NULL;

    getifaddrs(&ifAddrStruct);
    char addressBuffer[INET_ADDRSTRLEN];
    while(ifAddrStruct != NULL){
        if(ifAddrStruct->ifa_addr->sa_family == AF_INET){
            tmpAddrPtr = &((struct sockaddr_in *)ifAddrStruct->ifa_addr)->sin_addr;
            bzero(addressBuffer,INET_ADDRSTRLEN);
            inet_ntop(AF_INET,tmpAddrPtr,addressBuffer,INET_ADDRSTRLEN);
            if(strcmp(addressBuffer,"127.0.0.1") != 0 && strlen(addressBuffer) > 1)
                break;
        }
        ifAddrStruct = ifAddrStruct->ifa_next;
    }

    if(strlen(addressBuffer) > 1)
        ip = string(addressBuffer);
    else{
        cout << "Get local ip error,now exit." << endl;
        exit(-1);
    }
    return ntohs(sin.sin_port);
}